

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::option_requires_argument_exception::option_requires_argument_exception
          (option_requires_argument_exception *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,anon_var_dwarf_51adf,option);
  std::operator+(&local_50,&local_30,anon_var_dwarf_52725);
  OptionParseException::OptionParseException(&this->super_OptionParseException,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__OptionException_00176380;
  return;
}

Assistant:

option_requires_argument_exception(const std::string& option)
    : OptionParseException(u8"Option ‘" + option + u8"’ requires an argument")
    {
    }